

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O0

REF_STATUS ref_dict_inspect(REF_DICT ref_dict)

{
  uint local_14;
  REF_INT i;
  REF_DICT ref_dict_local;
  
  printf("ref_dict = %p\n",ref_dict);
  printf(" n = %d, max = %d\n",(ulong)(uint)ref_dict->n,(ulong)(uint)ref_dict->max);
  for (local_14 = 0; (int)local_14 < ref_dict->n; local_14 = local_14 + 1) {
    printf(" %d [%d] = %d\n",(ulong)(uint)ref_dict->key[(int)local_14],(ulong)local_14,
           (ulong)(uint)ref_dict->value[(int)local_14]);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_dict_inspect(REF_DICT ref_dict) {
  REF_INT i;

  printf("ref_dict = %p\n", (void *)ref_dict);
  printf(" n = %d, max = %d\n", ref_dict_n(ref_dict), ref_dict_max(ref_dict));

  each_ref_dict_key_index(ref_dict, i) {
    printf(" %d [%d] = %d\n", ref_dict->key[i], i, ref_dict->value[i]);
  }

  return REF_SUCCESS;
}